

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall QDialogButtonBoxPrivate::handleButtonClicked(QDialogButtonBoxPrivate *this)

{
  QDialogButtonBox *this_00;
  ButtonRole BVar1;
  QAbstractButton *button;
  int *piVar2;
  long in_FS_OFFSET;
  QAbstractButton *local_40;
  void *local_38;
  QAbstractButton **local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogButtonBox **)&(this->super_QWidgetPrivate).field_0x8;
  QObject::sender();
  button = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
  if (button != (QAbstractButton *)0x0) {
    BVar1 = QDialogButtonBox::buttonRole(this_00,button);
    piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
    local_30 = &local_40;
    local_38 = (void *)0x0;
    local_40 = button;
    QMetaObject::activate((QObject *)this_00,&QDialogButtonBox::staticMetaObject,0,&local_38);
    if (piVar2 != (int *)0x0) {
      if (((piVar2[1] != 0) && ((uint)BVar1 < 7)) && ((0x73U >> (BVar1 & 0x1f) & 1) != 0)) {
        QMetaObject::activate
                  ((QObject *)this_00,&QDialogButtonBox::staticMetaObject,
                   *(int *)(&DAT_006dc818 + (ulong)(uint)BVar1 * 4),(void **)0x0);
      }
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::handleButtonClicked()
{
    Q_Q(QDialogButtonBox);
    if (QAbstractButton *button = qobject_cast<QAbstractButton *>(q->sender())) {
        // Can't fetch this *after* emitting clicked, as clicked may destroy the button
        // or change its role. Now changing the role is not possible yet, but arguably
        // both clicked and accepted/rejected/etc. should be emitted "atomically"
        // depending on whatever role the button had at the time of the click.
        const QDialogButtonBox::ButtonRole buttonRole = q->buttonRole(button);
        QPointer<QDialogButtonBox> guard(q);

        emit q->clicked(button);

        if (!guard)
            return;

        switch (QPlatformDialogHelper::ButtonRole(buttonRole)) {
        case QPlatformDialogHelper::AcceptRole:
        case QPlatformDialogHelper::YesRole:
            emit q->accepted();
            break;
        case QPlatformDialogHelper::RejectRole:
        case QPlatformDialogHelper::NoRole:
            emit q->rejected();
            break;
        case QPlatformDialogHelper::HelpRole:
            emit q->helpRequested();
            break;
        default:
            break;
        }
    }
}